

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

clockval_t *
tchecker::clockval_allocate_and_construct(unsigned_short size,clock_rational_value_t value)

{
  clockval_t *ptr;
  int in_EDI;
  unsigned_short local_2a;
  rational<long> local_28;
  
  local_2a = (unsigned_short)in_EDI;
  ptr = (clockval_t *)operator_new__((ulong)(uint)(in_EDI << 4) + 0x10);
  clockval_t::construct<unsigned_short&,boost::rational<long>&>(ptr,&local_2a,&local_28);
  return ptr;
}

Assistant:

tchecker::clockval_t * clockval_allocate_and_construct(unsigned short size, tchecker::clock_rational_value_t value)
{
  char * ptr = new char[tchecker::allocation_size_t<tchecker::clockval_t>::alloc_size(size)];
  tchecker::clockval_t::construct(ptr, size, value);
  return reinterpret_cast<tchecker::clockval_t *>(ptr);
}